

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::socks5_alert::message_abi_cxx11_(string *__return_storage_ptr__,socks5_alert *this)

{
  error_category *peVar1;
  endpoint *ep;
  char *pcVar2;
  char buf [512];
  undefined8 local_268 [4];
  string local_248;
  char local_228 [512];
  
  if ((ulong)this->op < 0x2b) {
    pcVar2 = operation_name::names[this->op];
  }
  else {
    pcVar2 = "unknown operation";
  }
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(local_268,peVar1,(ulong)(uint)(this->error).val_);
  print_endpoint_abi_cxx11_(&local_248,(libtorrent *)&this->ip,ep);
  snprintf(local_228,0x200,"SOCKS5 error. op: %s ec: %s ep: %s",pcVar2,local_268[0],
           local_248._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_228,(allocator<char> *)local_268);
  return __return_storage_ptr__;
}

Assistant:

std::string socks5_alert::message() const
	{
		char buf[512];
		std::snprintf(buf, sizeof(buf), "SOCKS5 error. op: %s ec: %s ep: %s"
			, operation_name(op), error.message().c_str(), print_endpoint(ip).c_str());
		return buf;
	}